

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderFrameBorder(ImVec2 p_min,ImVec2 p_max,float rounding)

{
  float in_stack_00000010;
  ImDrawCornerFlags in_stack_00000014;
  float in_stack_00000018;
  ImU32 in_stack_0000001c;
  ImVec2 *in_stack_00000020;
  ImVec2 *in_stack_00000028;
  ImDrawList *in_stack_00000030;
  float border_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *this;
  ImDrawList *pIVar1;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  float local_2c;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  
  local_20 = GImGui;
  local_28 = GImGui->CurrentWindow;
  local_2c = (GImGui->Style).FrameBorderSize;
  if (0.0 < local_2c) {
    pIVar1 = local_28->DrawList;
    this = &local_3c;
    ImVec2::ImVec2(this,1.0,1.0);
    local_34 = ::operator+(this,(ImVec2 *)0x1a5246);
    ImVec2::ImVec2(&local_4c,1.0,1.0);
    local_44 = ::operator+(this,(ImVec2 *)0x1a5273);
    GetColorU32((ImGuiCol)((ulong)pIVar1 >> 0x20),SUB84(pIVar1,0));
    ImDrawList::AddRect(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                        in_stack_00000018,in_stack_00000014,in_stack_00000010);
    GetColorU32((ImGuiCol)((ulong)pIVar1 >> 0x20),SUB84(pIVar1,0));
    ImDrawList::AddRect(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                        in_stack_00000018,in_stack_00000014,in_stack_00000010);
  }
  return;
}

Assistant:

void ImGui::RenderFrameBorder(ImVec2 p_min, ImVec2 p_max, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const float border_size = g.Style.FrameBorderSize;
    if (border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min+ImVec2(1,1), p_max+ImVec2(1,1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}